

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O0

int set_target_network_interface(int socket,char *mac_address)

{
  void *__optval;
  int iVar1;
  LOGGER_LOG p_Var2;
  size_t sVar3;
  int *piVar4;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  NETWORK_INTERFACE_DESCRIPTION *current_nid;
  LOGGER_LOG l;
  NETWORK_INTERFACE_DESCRIPTION *nid;
  char *pcStack_18;
  int result;
  char *mac_address_local;
  int socket_local;
  
  pcStack_18 = mac_address;
  mac_address_local._4_4_ = socket;
  iVar1 = get_network_interface_descriptions(socket,(NETWORK_INTERFACE_DESCRIPTION **)&l);
  if (iVar1 == 0) {
    l_1 = l;
    while ((l_1 != (LOGGER_LOG)0x0 && (iVar1 = strcmp(pcStack_18,*(char **)(l_1 + 8)), iVar1 != 0)))
    {
      l_1 = *(LOGGER_LOG *)(l_1 + 0x18);
    }
    iVar1 = mac_address_local._4_4_;
    if (l_1 == (LOGGER_LOG)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/socketio_berkeley.c"
                  ,"set_target_network_interface",0x1ee,1,
                  "Did not find a network interface matching MAC ADDRESS");
      }
      nid._4_4_ = 0x1ef;
    }
    else {
      __optval = *(void **)l_1;
      sVar3 = strlen(*(char **)l_1);
      iVar1 = setsockopt(iVar1,1,0x19,__optval,(socklen_t)sVar3);
      if (iVar1 == 0) {
        nid._4_4_ = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          piVar4 = __errno_location();
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/socketio_berkeley.c"
                    ,"set_target_network_interface",499,1,"setsockopt failed (%d)",*piVar4);
        }
        nid._4_4_ = 500;
      }
    }
    destroy_network_interface_descriptions((NETWORK_INTERFACE_DESCRIPTION *)l);
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/socketio_berkeley.c"
                ,"set_target_network_interface",0x1db,1,
                "Failed getting network interface descriptions");
    }
    nid._4_4_ = 0x1dc;
  }
  return nid._4_4_;
}

Assistant:

static int set_target_network_interface(int socket, char* mac_address)
{
    int result;
    NETWORK_INTERFACE_DESCRIPTION* nid;

    if (get_network_interface_descriptions(socket, &nid) != 0)
    {
        LogError("Failed getting network interface descriptions");
        result = MU_FAILURE;
    }
    else
    {
        NETWORK_INTERFACE_DESCRIPTION* current_nid = nid;

        while(current_nid != NULL)
        {
            if (strcmp(mac_address, current_nid->mac_address) == 0)
            {
                break;
            }

            current_nid = current_nid->next;
        }

        if (current_nid == NULL)
        {
            LogError("Did not find a network interface matching MAC ADDRESS");
            result = MU_FAILURE;
        }
        else if (setsockopt(socket, SOL_SOCKET, SO_BINDTODEVICE, current_nid->name, strlen(current_nid->name)) != 0)
        {
            LogError("setsockopt failed (%d)", errno);
            result = MU_FAILURE;
        }
        else
        {
            result = 0;
        }

        destroy_network_interface_descriptions(nid);
    }

    return result;
}